

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O0

ui32_t __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::ArchiveLength
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this)

{
  bool bVar1;
  int iVar2;
  pointer pPVar3;
  _Self local_28;
  _Self local_20;
  const_iterator l_i;
  ui32_t arch_size;
  SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this_local;
  
  l_i._M_node._4_4_ = 0;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::begin
                 (&this->
                   super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                 );
  while( true ) {
    local_28._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>::end
                   (&this->
                     super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                   );
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    pPVar3 = std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator->(&local_20);
    iVar2 = (*(pPVar3->super_IArchive)._vptr_IArchive[3])();
    l_i._M_node._4_4_ = iVar2 + l_i._M_node._4_4_;
    std::_List_const_iterator<ASDCP::MXF::RIP::PartitionPair>::operator++(&local_20,0);
  }
  return l_i._M_node._4_4_;
}

Assistant:

ui32_t ArchiveLength() const {
	    ui32_t arch_size = 0;

	    typename std::list<T>::const_iterator l_i = this->begin();

	    for ( ; l_i != this->end(); l_i++ )
	      arch_size += l_i->ArchiveLength();
	    
	    return arch_size;
	  }